

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomimp.cpp
# Opt level: O0

int AF_A_TroopAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int iVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  PClassActor *type;
  bool bVar4;
  int local_9c;
  bool local_6e;
  bool local_6b;
  TAngle<double> local_68;
  FName local_60;
  int local_5c;
  FSoundID local_58;
  int newdam;
  void *pvStack_50;
  int damage;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomimp.cpp"
                  ,0x14,"int AF_A_TroopAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_6b = true;
    if (stateowner != (AActor *)0x0) {
      local_6b = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_6b == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomimp.cpp"
                    ,0x14,"int AF_A_TroopAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar4 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomimp.cpp"
                      ,0x14,"int AF_A_TroopAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_6e = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_6e = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_6e == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomimp.cpp"
                      ,0x14,"int AF_A_TroopAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar4 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomimp.cpp"
                      ,0x14,"int AF_A_TroopAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      pvStack_50 = pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      pvStack_50 = (void *)0x0;
    }
    pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
    if (pAVar2 != (AActor *)0x0) {
      A_FaceTarget(stateowner);
      bVar4 = AActor::CheckMeleeRange(stateowner);
      pAVar2 = stateowner;
      if (bVar4) {
        iVar1 = FRandom::operator()(&pr_troopattack);
        pAVar2 = stateowner;
        newdam = (iVar1 % 8 + 1) * 3;
        FSoundID::FSoundID(&local_58,"imp/melee");
        S_Sound(pAVar2,1,&local_58,1.0,1.0);
        pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
        pAVar2 = stateowner;
        iVar1 = newdam;
        FName::FName(&local_60,NAME_Melee);
        TAngle<double>::TAngle(&local_68,0.0);
        local_5c = P_DamageMobj(pAVar3,pAVar2,pAVar2,iVar1,&local_60,0,&local_68);
        local_9c = local_5c;
        if (local_5c < 1) {
          local_9c = newdam;
        }
        pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
        P_TraceBleed(local_9c,pAVar2,stateowner);
      }
      else {
        pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
        type = PClass::FindActor("DoomImpBall");
        P_SpawnMissile(pAVar2,pAVar3,type,(AActor *)0x0);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomimp.cpp"
                ,0x14,"int AF_A_TroopAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_TroopAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		int damage = (pr_troopattack()%8+1)*3;
		S_Sound (self, CHAN_WEAPON, "imp/melee", 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
		return 0;
	}
	
	// launch a missile
	P_SpawnMissile (self, self->target, PClass::FindActor("DoomImpBall"));
	return 0;
}